

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void __thiscall llvm::yaml::Input::~Input(Input *this)

{
  Input *this_local;
  
  (this->super_IO)._vptr_IO = (_func_int **)&PTR__Input_030a5350;
  std::vector<bool,_std::allocator<bool>_>::~vector(&this->BitValuesUsed);
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl
            (&this->StringAllocator);
  std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>::
  ~unique_ptr(&this->TopNode);
  std::unique_ptr<llvm::yaml::Stream,_std::default_delete<llvm::yaml::Stream>_>::~unique_ptr
            (&this->Strm);
  SourceMgr::~SourceMgr(&this->SrcMgr);
  IO::~IO(&this->super_IO);
  return;
}

Assistant:

Input::~Input() = default;